

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip.c
# Opt level: O0

ssize_t zip_entry_noallocread(zip_t *zip,void *buf,size_t bufsize)

{
  mz_bool mVar1;
  mz_zip_archive *pzip;
  size_t bufsize_local;
  void *buf_local;
  zip_t *zip_local;
  
  if (zip == (zip_t *)0x0) {
    zip_local = (zip_t *)0xffffffffffffffff;
  }
  else if (((zip->archive).m_zip_mode == MZ_ZIP_MODE_READING) && (-1 < (zip->entry).index)) {
    mVar1 = mz_zip_reader_extract_to_mem_no_alloc
                      (&zip->archive,(mz_uint)(zip->entry).index,buf,bufsize,0,(void *)0x0,0);
    if (mVar1 == 0) {
      zip_local = (zip_t *)0xffffffffffffffee;
    }
    else {
      zip_local = (zip_t *)(zip->entry).uncomp_size;
    }
  }
  else {
    zip_local = (zip_t *)0xfffffffffffffffd;
  }
  return (ssize_t)zip_local;
}

Assistant:

ssize_t zip_entry_noallocread(struct zip_t *zip, void *buf, size_t bufsize) {
  mz_zip_archive *pzip = NULL;

  if (!zip) {
    // zip_t handler is not initialized
    return (ssize_t)ZIP_ENOINIT;
  }

  pzip = &(zip->archive);
  if (pzip->m_zip_mode != MZ_ZIP_MODE_READING ||
      zip->entry.index < (ssize_t)0) {
    // the entry is not found or we do not have read access
    return (ssize_t)ZIP_ENOENT;
  }

  if (!mz_zip_reader_extract_to_mem_no_alloc(pzip, (mz_uint)zip->entry.index,
                                             buf, bufsize, 0, NULL, 0)) {
    return (ssize_t)ZIP_EMEMNOALLOC;
  }

  return (ssize_t)zip->entry.uncomp_size;
}